

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O2

void mergesort_4way_unstable(uchar **strings,size_t n,uchar **tmp)

{
  ulong uVar1;
  ulong uVar2;
  ulong n_00;
  undefined1 auVar3 [16];
  double dVar4;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,(size_t)tmp);
    return;
  }
  n_00 = n >> 2;
  auVar3._8_4_ = (int)(n >> 0x20);
  auVar3._0_8_ = n;
  auVar3._12_4_ = 0x45300000;
  uVar2 = n >> 1;
  dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.75;
  uVar1 = (ulong)dVar4;
  uVar1 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  mergesort_4way_unstable(strings,n_00,tmp);
  mergesort_4way_unstable(strings + n_00,uVar2 - n_00,tmp);
  mergesort_4way_unstable(strings + uVar2,uVar1 - uVar2,tmp);
  mergesort_4way_unstable(strings + uVar1,n - uVar1,tmp);
  merge_4way_unstable(strings,n_00,strings + n_00,uVar2 - n_00,strings + uVar2,uVar1 - uVar2,
                      strings + uVar1,n - uVar1,tmp);
  memcpy(strings,tmp,n << 3);
  return;
}

Assistant:

void
mergesort_4way_unstable(unsigned char** strings, size_t n, unsigned char** tmp)
{
	//debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = size_t(0.75*n);
	mergesort_4way_unstable(strings,        split0,        tmp);
	mergesort_4way_unstable(strings+split0, split1-split0, tmp);
	mergesort_4way_unstable(strings+split1, split2-split1, tmp);
	mergesort_4way_unstable(strings+split2, n-split2,      tmp);
	merge_4way_unstable(strings,        split0,
	                    strings+split0, split1-split0,
	                    strings+split1, split2-split1,
	                    strings+split2, n-split2,
	                    tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}